

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

int __thiscall
ON__CChangeTextureCoordinateHelper::DupVertex(ON__CChangeTextureCoordinateHelper *this,int vi)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  ON_Mesh *pOVar5;
  ON_3fPoint *pOVar6;
  ON_3dPoint *pOVar7;
  ON_2fPoint *pOVar8;
  ON_3fVector *pOVar9;
  ON_Color *pOVar10;
  ON_2dPoint *pOVar11;
  ON_SurfaceCurvature *pOVar12;
  bool *pbVar13;
  ON_TextureCoordinates *pOVar14;
  double dVar15;
  float fVar16;
  int *piVar17;
  long lVar18;
  ON_3fPoint *pOVar19;
  ON_3dPoint *pOVar20;
  ON_2fPoint *pOVar21;
  ON_3fVector *pOVar22;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar23;
  long lVar24;
  ON_2dPoint *pOVar25;
  ON_SurfaceCurvature *pOVar26;
  bool *pbVar27;
  long lVar28;
  
  if (this->m_vuse_count == 0) {
    uVar2 = (this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
    this->m_vuse_count = uVar2;
    if ((uint)(this->m_vuse).m_capacity < uVar2) {
      ON_SimpleArray<unsigned_int>::SetCapacity(&this->m_vuse,(long)(int)uVar2);
    }
    iVar3 = this->m_vuse_count;
    uVar2 = (this->m_vuse).m_capacity;
    if (iVar3 <= (int)uVar2 && -1 < iVar3) {
      (this->m_vuse).m_count = iVar3;
    }
    puVar4 = (this->m_vuse).m_a;
    if (0 < (int)uVar2 && puVar4 != (uint *)0x0) {
      memset(puVar4,0,(ulong)uVar2 << 2);
    }
    pOVar5 = this->m_mesh;
    if (0 < (pOVar5->m_F).m_count) {
      puVar4 = (this->m_vuse).m_a;
      piVar17 = ((pOVar5->m_F).m_a)->vi + 3;
      lVar24 = 0;
      do {
        iVar3 = ((ON_MeshFace *)(piVar17 + -3))->vi[0];
        if ((-1 < (long)iVar3) && (iVar3 < this->m_vuse_count)) {
          puVar4[iVar3] = puVar4[iVar3] + 1;
        }
        iVar3 = piVar17[-2];
        if ((-1 < (long)iVar3) && (iVar3 < this->m_vuse_count)) {
          puVar4[iVar3] = puVar4[iVar3] + 1;
        }
        iVar3 = piVar17[-1];
        if ((-1 < (long)iVar3) && (iVar3 < this->m_vuse_count)) {
          puVar4[iVar3] = puVar4[iVar3] + 1;
        }
        iVar3 = *piVar17;
        if (((-1 < (long)iVar3) && (piVar17[-1] != iVar3)) && (iVar3 < this->m_vuse_count)) {
          puVar4[iVar3] = puVar4[iVar3] + 1;
        }
        lVar24 = lVar24 + 1;
        piVar17 = piVar17 + 4;
      } while (lVar24 < (pOVar5->m_F).m_count);
    }
  }
  if ((-1 < vi) && (vi < this->m_vuse_count)) {
    puVar4 = (this->m_vuse).m_a;
    uVar2 = puVar4[(uint)vi];
    if (uVar2 < 2) {
      return vi;
    }
    puVar4[(uint)vi] = uVar2 - 1;
  }
  ON_SimpleArray<ON_3fPoint>::AppendNew(&(this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>);
  pOVar6 = (this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
  lVar24 = (long)(this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  pOVar19 = (ON_3fPoint *)0x0;
  if (0 < lVar24) {
    pOVar19 = pOVar6 + lVar24 + -1;
  }
  pOVar19->z = pOVar6[vi].z;
  fVar16 = pOVar6[vi].y;
  pOVar19->x = pOVar6[vi].x;
  pOVar19->y = fVar16;
  if (&this->m_mesh_dV->super_ON_SimpleArray<ON_3dPoint> != (ON_SimpleArray<ON_3dPoint> *)0x0) {
    ON_SimpleArray<ON_3dPoint>::AppendNew(&this->m_mesh_dV->super_ON_SimpleArray<ON_3dPoint>);
    pOVar7 = (this->m_mesh_dV->super_ON_SimpleArray<ON_3dPoint>).m_a;
    lVar24 = (long)(this->m_mesh_dV->super_ON_SimpleArray<ON_3dPoint>).m_count;
    pOVar20 = (ON_3dPoint *)0x0;
    if (0 < lVar24) {
      pOVar20 = pOVar7 + lVar24 + -1;
    }
    dVar15 = pOVar7[vi].y;
    pOVar20->x = pOVar7[vi].x;
    pOVar20->y = dVar15;
    pOVar20->z = pOVar7[vi].z;
  }
  if (this->m_bHasVertexTextures == true) {
    ON_SimpleArray<ON_2fPoint>::AppendNew(&(this->m_mesh->m_T).super_ON_SimpleArray<ON_2fPoint>);
    pOVar8 = (this->m_mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a;
    lVar24 = (long)(this->m_mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count;
    pOVar21 = (ON_2fPoint *)0x0;
    if (0 < lVar24) {
      pOVar21 = pOVar8 + lVar24 + -1;
    }
    *pOVar21 = pOVar8[vi];
  }
  if (this->m_bHasVertexNormals == true) {
    ON_SimpleArray<ON_3fVector>::AppendNew(&(this->m_mesh->m_N).super_ON_SimpleArray<ON_3fVector>);
    pOVar9 = (this->m_mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
    lVar24 = (long)(this->m_mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_count;
    pOVar22 = (ON_3fVector *)0x0;
    if (0 < lVar24) {
      pOVar22 = pOVar9 + lVar24 + -1;
    }
    fVar16 = pOVar9[vi].y;
    pOVar22->x = pOVar9[vi].x;
    pOVar22->y = fVar16;
    pOVar22->z = pOVar9[vi].z;
  }
  if (this->m_bHasVertexColors == true) {
    ON_SimpleArray<ON_Color>::AppendNew(&this->m_mesh->m_C);
    pOVar10 = (this->m_mesh->m_C).m_a;
    lVar24 = (long)(this->m_mesh->m_C).m_count;
    paVar23 = (anon_union_4_2_6147a14e_for_ON_Color_15 *)0x0;
    if (0 < lVar24) {
      paVar23 = &pOVar10[lVar24 + -1].field_0;
    }
    *paVar23 = pOVar10[vi].field_0;
  }
  if (this->m_bHasSurfaceParameters == true) {
    ON_SimpleArray<ON_2dPoint>::AppendNew(&(this->m_mesh->m_S).super_ON_SimpleArray<ON_2dPoint>);
    pOVar11 = (this->m_mesh->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a;
    lVar24 = (long)(this->m_mesh->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count;
    pOVar25 = (ON_2dPoint *)0x0;
    if (0 < lVar24) {
      pOVar25 = pOVar11 + lVar24 + -1;
    }
    pOVar11 = pOVar11 + vi;
    dVar15 = pOVar11->y;
    pOVar25->x = pOVar11->x;
    pOVar25->y = dVar15;
  }
  if (this->m_bHasPrincipalCurvatures == true) {
    ON_SimpleArray<ON_SurfaceCurvature>::AppendNew(&this->m_mesh->m_K);
    pOVar12 = (this->m_mesh->m_K).m_a;
    lVar24 = (long)(this->m_mesh->m_K).m_count;
    pOVar26 = (ON_SurfaceCurvature *)0x0;
    if (0 < lVar24) {
      pOVar26 = pOVar12 + lVar24 + -1;
    }
    pOVar12 = pOVar12 + vi;
    dVar15 = pOVar12->k2;
    pOVar26->k1 = pOVar12->k1;
    pOVar26->k2 = dVar15;
  }
  if (this->m_bHasHiddenVertices == true) {
    ON_SimpleArray<bool>::AppendNew(&this->m_mesh->m_H);
    pOVar5 = this->m_mesh;
    pbVar13 = (pOVar5->m_H).m_a;
    bVar1 = pbVar13[vi];
    lVar24 = (long)(pOVar5->m_H).m_count;
    pbVar27 = (bool *)0x0;
    if (0 < lVar24) {
      pbVar27 = pbVar13 + lVar24 + -1;
    }
    *pbVar27 = bVar1;
    if (bVar1 == true) {
      pOVar5->m_hidden_count = pOVar5->m_hidden_count + 1;
    }
  }
  if ((this->m_bHasCachedTextures == true) && (lVar24 = (long)(this->m_TC).m_count, 0 < lVar24)) {
    lVar28 = 0;
    do {
      pOVar14 = (this->m_TC).m_a[lVar28];
      ON_SimpleArray<ON_3fPoint>::AppendNew(&pOVar14->m_T);
      pOVar6 = (pOVar14->m_T).m_a;
      lVar18 = (long)(pOVar14->m_T).m_count;
      pOVar19 = pOVar6 + lVar18 + -1;
      if (lVar18 < 1) {
        pOVar19 = (ON_3fPoint *)0x0;
      }
      pOVar19->z = pOVar6[vi].z;
      fVar16 = pOVar6[vi].y;
      pOVar19->x = pOVar6[vi].x;
      pOVar19->y = fVar16;
      lVar28 = lVar28 + 1;
    } while (lVar24 != lVar28);
  }
  return (this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count + -1;
}

Assistant:

int ON__CChangeTextureCoordinateHelper::DupVertex(int vi)
{
  if ( 0 == m_vuse_count )
  {
    // m_vuse[] is an array of length = original number of
    // vertices in m_mesh and m_vuse[vi] = number of faces
    // that reference vertex vi. If this vertex needs to be
    // split, vuse[vi] is decremented.  The ultimate goal
    // is to split a few times as needed so we don't
    // bloat the mesh with repeated calls to changing
    // texture maps. m_vuse[] is set the first time
    // DupVertex() is called.
    m_vuse_count = m_mesh.m_V.Count();
    m_vuse.Reserve(m_vuse_count);
    m_vuse.SetCount(m_vuse_count);
    m_vuse.Zero();
    for ( int fi = 0; fi < m_mesh.m_F.Count(); fi++ )
    {
      const int* Fvi = m_mesh.m_F[fi].vi;
      int i = Fvi[0];
      if ( i >= 0 && i < m_vuse_count )
        m_vuse[i]++;
      i = Fvi[1];
      if ( i >= 0 && i < m_vuse_count )
        m_vuse[i]++;
      i = Fvi[2];
      if ( i >= 0 && i < m_vuse_count )
        m_vuse[i]++;
      i = Fvi[3];
      if ( Fvi[2] != i && i >= 0 && i < m_vuse_count )
        m_vuse[i]++;
    }
  }

  if ( vi >= 0 && vi < m_vuse_count )
  {
    if ( m_vuse[vi] <= 1 )
      return vi; // only one face uses this vertex - no need to dup the vertex

    // otherwise we will duplicate this vertex, reducing its use count by 1.
    m_vuse[vi]--;
  }


  m_mesh.m_V.AppendNew();
  *m_mesh.m_V.Last() = m_mesh.m_V[vi];
  if ( 0 != m_mesh_dV )
  {
    m_mesh_dV->AppendNew();
    *(m_mesh_dV->Last()) = m_mesh_dV->operator[](vi);
  }
  if ( m_bHasVertexTextures )
  {
    m_mesh.m_T.AppendNew();
    *m_mesh.m_T.Last() = m_mesh.m_T[vi];
  }
  if ( m_bHasVertexNormals )
  {
    m_mesh.m_N.AppendNew();
    *m_mesh.m_N.Last() = m_mesh.m_N[vi];
  }
  if ( m_bHasVertexColors )
  {
    m_mesh.m_C.AppendNew();
    *m_mesh.m_C.Last() = m_mesh.m_C[vi];
  }
  if ( m_bHasSurfaceParameters )
  {
    m_mesh.m_S.AppendNew();
    *m_mesh.m_S.Last() = m_mesh.m_S[vi];
  }
  if ( m_bHasPrincipalCurvatures )
  {
    m_mesh.m_K.AppendNew();
    *m_mesh.m_K.Last() = m_mesh.m_K[vi];
  }
  if ( m_bHasHiddenVertices )
  {
    m_mesh.m_H.AppendNew();
    if ( 0 != (*m_mesh.m_H.Last() = m_mesh.m_H[vi]) )
      m_mesh.m_hidden_count++;
  }

  if ( m_bHasCachedTextures )
  {
    // Note:  This m_TC[] is the subset of m_mesh.m_TC[]
    //        that need to be duped.  The constructor
    //        insures that m_TC[i] is not nullptr and
    //        has the right count and capacity.
    //
    //        DO NOT REFERENCE m_mesh.m_TC[] in this block.
    int tccount = m_TC.Count();
    for ( int i = 0; i < tccount; i++ )
    {
      ON_SimpleArray<ON_3fPoint>& T = m_TC[i]->m_T;
      T.AppendNew();
      *T.Last() = T[vi];
    }
  }

  return m_mesh.m_V.Count()-1;
}